

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::GetDefaultDirectoryPermissions(cmFileCopier *this,mode_t **mode)

{
  cmMakefile *this_00;
  cmCommand *this_01;
  pointer pbVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  pointer arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  string local_1b8;
  ostream local_198;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
             (allocator<char> *)&local_1b8);
  pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    *mode = (mode_t *)0x0;
LAB_002a3260:
    bVar2 = true;
  }
  else {
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,pcVar3,(allocator<char> *)&local_1b8);
    cmSystemTools::ExpandListArgument((string *)&local_198,&local_1d8,false);
    std::__cxx11::string::~string((string *)&local_198);
    pbVar1 = local_1d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    arg = local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (arg == pbVar1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8);
        goto LAB_002a3260;
      }
      bVar2 = CheckPermissions(this,arg,*mode);
      arg = arg + 1;
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    pcVar3 = cmCommand::GetError(&this->FileCommand->super_cmCommand);
    poVar4 = std::operator<<(&local_198,pcVar3);
    std::operator<<(poVar4," Set with CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS variable.");
    this_01 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_01,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmFileCopier::GetDefaultDirectoryPermissions(mode_t** mode)
{
  // check if default dir creation permissions were set
  const char* default_dir_install_permissions = this->Makefile->GetDefinition(
    "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!this->CheckPermissions(arg, **mode)) {
        std::ostringstream e;
        e << this->FileCommand->GetError()
          << " Set with CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
             "variable.";
        this->FileCommand->SetError(e.str());
        return false;
      }
    }
  } else {
    *mode = nullptr;
  }

  return true;
}